

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_symmetric_difference_count(bitset_t *b1,bitset_t *b2)

{
  int iVar1;
  long *in_RSI;
  long *in_RDI;
  size_t answer;
  size_t k;
  size_t minlength;
  ulong local_30;
  size_t local_28;
  ulong local_20;
  
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    local_30 = in_RDI[1];
  }
  else {
    local_30 = in_RSI[1];
  }
  local_28 = 0;
  for (local_20 = 0; local_20 < local_30; local_20 = local_20 + 1) {
    iVar1 = roaring_hamming(*(ulong *)(*in_RDI + local_20 * 8) ^ *(ulong *)(*in_RSI + local_20 * 8))
    ;
    local_28 = (long)iVar1 + local_28;
  }
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    for (; local_20 < (ulong)in_RSI[1]; local_20 = local_20 + 1) {
      iVar1 = roaring_hamming(*(uint64_t *)(*in_RSI + local_20 * 8));
      local_28 = (long)iVar1 + local_28;
    }
  }
  else {
    for (; local_20 < (ulong)in_RDI[1]; local_20 = local_20 + 1) {
      iVar1 = roaring_hamming(*(uint64_t *)(*in_RDI + local_20 * 8));
      local_28 = (long)iVar1 + local_28;
    }
  }
  return local_28;
}

Assistant:

size_t bitset_symmetric_difference_count(
    const bitset_t *CROARING_CBITSET_RESTRICT b1,
    const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    size_t answer = 0;
    for (; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] ^ b2->array[k]);
    }
    if (b2->arraysize > b1->arraysize) {
        for (; k < b2->arraysize; ++k) {
            answer += roaring_hamming(b2->array[k]);
        }
    } else {
        for (; k < b1->arraysize; ++k) {
            answer += roaring_hamming(b1->array[k]);
        }
    }
    return answer;
}